

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

void google::protobuf::compiler::cpp::anon_unknown_0::Flatten
               (Descriptor *descriptor,
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *flatten)

{
  pointer *pppDVar1;
  iterator __position;
  long lVar2;
  long lVar3;
  Descriptor *local_28;
  
  local_28 = descriptor;
  if (0 < *(int *)(descriptor + 0x70)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      Flatten((Descriptor *)(*(long *)(descriptor + 0x38) + lVar3),flatten);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x90;
    } while (lVar2 < *(int *)(descriptor + 0x70));
  }
  __position._M_current =
       (flatten->
       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (flatten->
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
    ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
              ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                *)flatten,__position,&local_28);
  }
  else {
    *__position._M_current = descriptor;
    pppDVar1 = &(flatten->
                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar1 = *pppDVar1 + 1;
  }
  return;
}

Assistant:

void Flatten(const Descriptor* descriptor,
             std::vector<const Descriptor*>* flatten) {
  for (int i = 0; i < descriptor->nested_type_count(); i++)
    Flatten(descriptor->nested_type(i), flatten);
  flatten->push_back(descriptor);
}